

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

void __thiscall DnsStats::UpdateDuration(DnsStats *this,my_bpftimeval ts)

{
  int64_t iVar1;
  int64_t delta_t;
  DnsStats *this_local;
  my_bpftimeval ts_local;
  
  if ((this->t_start_sec == 0) && (this->t_start_usec == 0)) {
    this->t_start_sec = (uint32_t)ts.tv_sec;
    this->t_start_usec = (uint32_t)ts.tv_usec;
  }
  else {
    iVar1 = DeltaUsec(ts.tv_sec,ts.tv_usec,(ulong)this->t_start_sec,(ulong)this->t_start_usec);
    if (iVar1 < 0) {
      this->t_start_sec = (uint32_t)ts.tv_sec;
      this->t_start_usec = (uint32_t)ts.tv_usec;
      this->duration_usec = this->duration_usec - iVar1;
    }
    else if (this->duration_usec < iVar1) {
      this->duration_usec = iVar1;
    }
  }
  return;
}

Assistant:

void DnsStats::UpdateDuration(my_bpftimeval ts)
{
    if (t_start_sec == 0 && t_start_usec == 0) {
        t_start_sec = ts.tv_sec;
        t_start_usec = ts.tv_usec;
    }
    else {
        int64_t delta_t = DeltaUsec(ts.tv_sec, ts.tv_usec, t_start_sec, t_start_usec);

        if (delta_t < 0) {
            t_start_sec = ts.tv_sec;
            t_start_usec = ts.tv_usec;
            duration_usec -= delta_t;
        }
        else if (delta_t > duration_usec) {
            duration_usec = delta_t;
        }
    }
}